

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

IGUITabControl * __thiscall
irr::gui::CGUIEnvironment::addTabControl
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,bool fillbackground,
          bool border,s32 id)

{
  int *piVar1;
  long lVar2;
  CGUITabControl *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUITabControl *)operator_new(0x1a0);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUITabControl::CGUITabControl
            (this_00,&this->super_IGUIEnvironment,parent_00,rectangle,fillbackground,border,id);
  lVar2 = *(long *)(*(long *)this_00 + -0x18);
  piVar1 = (int *)(&this_00->field_0x10 + lVar2);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
  }
  return (IGUITabControl *)this_00;
}

Assistant:

IGUITabControl *CGUIEnvironment::addTabControl(const core::rect<s32> &rectangle,
		IGUIElement *parent, bool fillbackground, bool border, s32 id)
{
	IGUITabControl *t = new CGUITabControl(this, parent ? parent : this,
			rectangle, fillbackground, border, id);
	t->drop();
	return t;
}